

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

point_t * opengv::triangulation::triangulate(RelativeAdapterBase *adapter,size_t index)

{
  CoeffReturnType pdVar1;
  Scalar *pSVar2;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  CoeffReturnType pdVar3;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *this_00;
  undefined8 in_RDX;
  long *in_RSI;
  point_t *in_RDI;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> mySVD;
  MatrixXd A;
  bearingVector_t f2;
  bearingVector_t f1;
  Matrix<double,_3,_4,_0,_3,_4> P2;
  Matrix<double,_3,_4,_0,_3,_4> P1;
  rotation_t R12;
  translation_t t12;
  point_t *worldPoint;
  RelativeAdapterBase *in_stack_fffffffffffff200;
  SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_> *in_stack_fffffffffffff208
  ;
  Index in_stack_fffffffffffff210;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff218;
  double dVar4;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
  *in_stack_fffffffffffff220;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1,_4,_false>_>_>
  *in_stack_fffffffffffff228;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1,_4,_false>_>_>
  *in_stack_fffffffffffff230;
  undefined8 in_stack_fffffffffffff238;
  uint computationOptions;
  MatrixType *in_stack_fffffffffffff240;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *in_stack_fffffffffffff248;
  double *in_stack_fffffffffffff250;
  undefined1 local_2b8 [24];
  undefined1 local_2a0 [72];
  non_const_type local_258;
  non_const_type local_1f8;
  undefined8 local_48;
  long *local_40;
  
  computationOptions = (uint)((ulong)in_stack_fffffffffffff238 >> 0x20);
  local_48 = in_RDX;
  local_40 = in_RSI;
  relative_pose::RelativeAdapterBase::gett12(in_stack_fffffffffffff200);
  relative_pose::RelativeAdapterBase::getR12(in_stack_fffffffffffff200);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::Zero();
  Eigen::Matrix<double,3,4,0,3,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,4,0,3,4>>>
            ((Matrix<double,_3,_4,_0,_3,_4> *)in_stack_fffffffffffff208,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
              *)in_stack_fffffffffffff200);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)in_stack_fffffffffffff218,
             in_stack_fffffffffffff210,(Index)in_stack_fffffffffffff208);
  Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)in_stack_fffffffffffff208,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffff200);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::Zero();
  Eigen::Matrix<double,3,4,0,3,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,4,0,3,4>>>
            ((Matrix<double,_3,_4,_0,_3,_4> *)in_stack_fffffffffffff208,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
              *)in_stack_fffffffffffff200);
  local_1f8 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         in_stack_fffffffffffff200);
  Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)in_stack_fffffffffffff218,
             in_stack_fffffffffffff210,(Index)in_stack_fffffffffffff208);
  Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)in_stack_fffffffffffff208,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
             in_stack_fffffffffffff200);
  local_258 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         in_stack_fffffffffffff200);
  Eigen::DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>::operator-
            ((DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
             in_stack_fffffffffffff220);
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>const>>
  ::operator*(in_stack_fffffffffffff220,
              (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffff218);
  Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)in_stack_fffffffffffff218,
             in_stack_fffffffffffff210,(Index)in_stack_fffffffffffff208);
  Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_false> *)in_stack_fffffffffffff208,
             (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)in_stack_fffffffffffff200);
  (**(code **)(*local_40 + 0x10))(local_2a0,local_40,local_48);
  (**(code **)(*local_40 + 0x18))(local_2b8,local_40,local_48);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff228,
             (int *)in_stack_fffffffffffff220,(int *)in_stack_fffffffffffff218);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffff208,
             (Index)in_stack_fffffffffffff200);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)in_stack_fffffffffffff218,
             in_stack_fffffffffffff210);
  Eigen::operator*(in_stack_fffffffffffff250,(StorageBaseType *)in_stack_fffffffffffff248);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffff208,
             (Index)in_stack_fffffffffffff200);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)in_stack_fffffffffffff218,
             in_stack_fffffffffffff210);
  Eigen::operator*(in_stack_fffffffffffff250,(StorageBaseType *)in_stack_fffffffffffff248);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>const>const,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,1,4,false>const>>
  ::operator-(in_stack_fffffffffffff230,in_stack_fffffffffffff228);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            (in_stack_fffffffffffff218,in_stack_fffffffffffff210);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
             in_stack_fffffffffffff208,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1,_4,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1,_4,_false>_>_>_>
              *)in_stack_fffffffffffff200);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffff208,
             (Index)in_stack_fffffffffffff200);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)in_stack_fffffffffffff218,
             in_stack_fffffffffffff210);
  Eigen::operator*(in_stack_fffffffffffff250,(StorageBaseType *)in_stack_fffffffffffff248);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffff208,
             (Index)in_stack_fffffffffffff200);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)in_stack_fffffffffffff218,
             in_stack_fffffffffffff210);
  Eigen::operator*(in_stack_fffffffffffff250,(StorageBaseType *)in_stack_fffffffffffff248);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>const>const,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,1,4,false>const>>
  ::operator-(in_stack_fffffffffffff230,in_stack_fffffffffffff228);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            (in_stack_fffffffffffff218,in_stack_fffffffffffff210);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
             in_stack_fffffffffffff208,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1,_4,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1,_4,_false>_>_>_>
              *)in_stack_fffffffffffff200);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffff208,
             (Index)in_stack_fffffffffffff200);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)in_stack_fffffffffffff218,
             in_stack_fffffffffffff210);
  Eigen::operator*(in_stack_fffffffffffff250,(StorageBaseType *)in_stack_fffffffffffff248);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffff208,
             (Index)in_stack_fffffffffffff200);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)in_stack_fffffffffffff218,
             in_stack_fffffffffffff210);
  Eigen::operator*(in_stack_fffffffffffff250,(StorageBaseType *)in_stack_fffffffffffff248);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>const>const,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,1,4,false>const>>
  ::operator-(in_stack_fffffffffffff230,in_stack_fffffffffffff228);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            (in_stack_fffffffffffff218,in_stack_fffffffffffff210);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
             in_stack_fffffffffffff208,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1,_4,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1,_4,_false>_>_>_>
              *)in_stack_fffffffffffff200);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffff208,
             (Index)in_stack_fffffffffffff200);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)in_stack_fffffffffffff218,
             in_stack_fffffffffffff210);
  Eigen::operator*(in_stack_fffffffffffff250,(StorageBaseType *)in_stack_fffffffffffff248);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)in_stack_fffffffffffff208,
             (Index)in_stack_fffffffffffff200);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)in_stack_fffffffffffff218,
             in_stack_fffffffffffff210);
  Eigen::operator*(in_stack_fffffffffffff250,(StorageBaseType *)in_stack_fffffffffffff248);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,4,1,1,4>const>const,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,1,4,false>const>>
  ::operator-(in_stack_fffffffffffff230,in_stack_fffffffffffff228);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
            (in_stack_fffffffffffff218,in_stack_fffffffffffff210);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)
             in_stack_fffffffffffff208,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1,_4,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_1,_4,_false>_>_>_>
              *)in_stack_fffffffffffff200);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (in_stack_fffffffffffff248,in_stack_fffffffffffff240,computationOptions);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0xcddfc5);
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
            (in_stack_fffffffffffff208);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                      in_stack_fffffffffffff208,(Index)in_stack_fffffffffffff200,0xcddfee);
  dVar4 = *pdVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff208,(Index)in_stack_fffffffffffff200);
  *pSVar2 = dVar4;
  this = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
                   (in_stack_fffffffffffff208);
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                      in_stack_fffffffffffff208,(Index)in_stack_fffffffffffff200,0xcde053);
  dVar4 = *pdVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff208,(Index)in_stack_fffffffffffff200);
  *pSVar2 = dVar4;
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
            (in_stack_fffffffffffff208);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                      in_stack_fffffffffffff208,(Index)in_stack_fffffffffffff200,0xcde0b9);
  dVar4 = *pdVar3;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff208,(Index)in_stack_fffffffffffff200);
  *pSVar2 = dVar4;
  Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>::matrixV
            (in_stack_fffffffffffff208);
  this_00 = (JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                       in_stack_fffffffffffff208,(Index)in_stack_fffffffffffff200,0xcde11d);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/(this,pdVar1);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_fffffffffffff200);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(this_00);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xcde171);
  return in_RDI;
}

Assistant:

opengv::point_t
opengv::triangulation::triangulate(
    const relative_pose::RelativeAdapterBase & adapter,
    size_t index )
{
  translation_t t12 = adapter.gett12();
  rotation_t R12 = adapter.getR12();
  Eigen::Matrix<double,3,4> P1 = Eigen::Matrix<double,3,4>::Zero();
  P1.block<3,3>(0,0) = Eigen::Matrix3d::Identity();
  Eigen::Matrix<double,3,4> P2 = Eigen::Matrix<double,3,4>::Zero();
  P2.block<3,3>(0,0) = R12.transpose();
  P2.block<3,1>(0,3) = -R12.transpose()*t12;
  bearingVector_t f1 = adapter.getBearingVector1(index);
  bearingVector_t f2 = adapter.getBearingVector2(index);

  Eigen::MatrixXd A(4,4);
  A.row(0) = f1[0] * P1.row(2) - f1[2] * P1.row(0);
  A.row(1) = f1[1] * P1.row(2) - f1[2] * P1.row(1);
  A.row(2) = f2[0] * P2.row(2) - f2[2] * P2.row(0);
  A.row(3) = f2[1] * P2.row(2) - f2[2] * P2.row(1);

  Eigen::JacobiSVD< Eigen::MatrixXd > mySVD(A, Eigen::ComputeFullV );
  point_t worldPoint;
  worldPoint[0] = mySVD.matrixV()(0,3);
  worldPoint[1] = mySVD.matrixV()(1,3);
  worldPoint[2] = mySVD.matrixV()(2,3);
  worldPoint = worldPoint / mySVD.matrixV()(3,3);

  return worldPoint;
}